

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
Decoder::decode(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *__return_storage_ptr__,string *msg)

{
  size_type sVar1;
  char *pcVar2;
  bool bVar3;
  undefined1 *resource;
  size_type sVar4;
  int iVar5;
  string result;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  sVar1 = msg->_M_string_length;
  resource = (undefined1 *)Resource_Reserve(sVar1 + 1);
  if (resource == (undefined1 *)0x0) {
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 1) = local_3f;
    *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 9) = local_37;
    *(undefined2 *)((long)&(__return_storage_ptr__->first).field_2 + 0xd) = local_33;
    (__return_storage_ptr__->first).field_2._M_local_buf[0xf] = local_31;
    (__return_storage_ptr__->first)._M_string_length = 0;
    __return_storage_ptr__->second = -1;
  }
  else {
    iVar5 = 1;
    if (sVar1 + 1 == 0) {
      bVar3 = false;
    }
    else {
      pcVar2 = (msg->_M_dataplus)._M_p;
      bVar3 = false;
      if (*pcVar2 == '#') {
        *resource = 0x21;
        bVar3 = true;
        iVar5 = 0;
        if (sVar1 != 0) {
          sVar4 = 0;
          do {
            resource[sVar4 + 1] = pcVar2[sVar4 + 1] + '\x01';
            sVar4 = sVar4 + 1;
          } while (sVar1 != sVar4);
        }
      }
    }
    if (bVar3) {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,resource,resource + sVar1)
      ;
      Resource_Free(resource);
      (__return_storage_ptr__->first)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->first).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_50,local_50 + local_48);
      __return_storage_ptr__->second = iVar5;
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
    }
    else {
      Resource_Free(resource);
      (__return_storage_ptr__->first)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 1) = local_3f;
      *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 9) = local_37;
      *(undefined2 *)((long)&(__return_storage_ptr__->first).field_2 + 0xd) = local_33;
      (__return_storage_ptr__->first).field_2._M_local_buf[0xf] = local_31;
      (__return_storage_ptr__->first)._M_string_length = 0;
      __return_storage_ptr__->second = iVar5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, int> decode(const std::string& msg)
	{
		size_t size = msg.size() + 1;
		union {
			void* void_ptr;
			char* char_ptr;
		} p = { Resource_Reserve(size) };

		if (!p.void_ptr)
			return std::make_pair(std::string(), -1);

		int errorCode = 0;

		if ((errorCode = details::decode(msg.data(), size, p.char_ptr)) != 0)
		{
			Resource_Free(p.void_ptr);
			return std::make_pair(std::string(), errorCode);
		}

		std::string result(p.char_ptr, size-1);

		Resource_Free(p.void_ptr);

		return { result, errorCode };
	}